

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_free(void *ptr)

{
  if ((longdouble *)ptr == &on_malloc_zero || ptr == (void *)0x0) {
    return;
  }
  if (((uint)ptr & 0x7fff) != 0x10) {
    block_slice_free(ptr);
    return;
  }
  munmap((void *)((long)ptr + -0x10),*(size_t *)((long)ptr + -0x10));
  return;
}

Assistant:

void fio_free(void *ptr) {
  if (!ptr || ptr == (void *)&on_malloc_zero)
    return;
  if (((uintptr_t)ptr & FIO_MEMORY_BLOCK_MASK) == 16) {
    /* big allocation - direct from the system */
    big_free(ptr);
    return;
  }
  /* allocated within block */
  block_slice_free(ptr);
}